

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O3

small_vector<double,_4UL,_0UL,_std::allocator<double>_> * __thiscall
itlib::small_vector<double,_4UL,_0UL,_std::allocator<double>_>::operator=
          (small_vector<double,_4UL,_0UL,_std::allocator<double>_> *this,
          small_vector<double,_4UL,_0UL,_std::allocator<double>_> *v)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  size_t sVar4;
  
  if (this != v) {
    this->m_end = this->m_begin;
    pdVar2 = choose_data(this,(long)v->m_end - (long)v->m_begin >> 3);
    this->m_end = pdVar2;
    this->m_begin = pdVar2;
    pdVar3 = v->m_begin;
    pdVar1 = pdVar2;
    if (pdVar3 != v->m_end) {
      do {
        *pdVar1 = *pdVar3;
        this->m_end = pdVar1 + 1;
        pdVar3 = pdVar3 + 1;
        pdVar1 = pdVar1 + 1;
      } while (pdVar3 != v->m_end);
    }
    sVar4 = 4;
    if ((type *)pdVar2 != this->m_static_data) {
      sVar4 = this->m_dynamic_capacity;
    }
    this->m_capacity = sVar4;
  }
  return this;
}

Assistant:

small_vector& operator=(const small_vector& v)
    {
        if (this == &v)
        {
            // prevent self usurp
            return *this;
        }

        clear();

        m_begin = m_end = choose_data(v.size());

        for (auto p = v.m_begin; p != v.m_end; ++p)
        {
            atraits::construct(get_alloc(), m_end, *p);
            ++m_end;
        }

        update_capacity();

        return *this;
    }